

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O0

void json_error(int err)

{
  char *local_18;
  char *errstr;
  int err_local;
  
  switch(err) {
  case 0:
    local_18 = "JSON string appears to be empty";
    break;
  case -3:
    local_18 = "JSMN_ERROR_PART - JSON string is too short, expecting more JSON data";
    break;
  case -2:
    local_18 = "JSMN_ERROR_INVAL - bad token, JSON string is corrupted";
    break;
  case -1:
    local_18 = "JSMN_ERROR_NOMEM - not enough tokens, JSON string is too large";
    break;
  default:
    local_18 = "Unknown error";
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
          ,0xb9,"JSON parsing failed: %s\n",local_18);
  return;
}

Assistant:

void
json_error(int err)
{
    const char *errstr;
    switch (err) {
    case JSMN_ERROR_INVAL:
        errstr = "JSMN_ERROR_INVAL - bad token, JSON string is corrupted";
        break;
    case JSMN_ERROR_NOMEM:
        errstr = "JSMN_ERROR_NOMEM - not enough tokens, JSON string is too large";
        break;
    case JSMN_ERROR_PART:
        errstr = "JSMN_ERROR_PART - JSON string is too short, expecting more JSON data";
        break;
    case 0:
        errstr = "JSON string appears to be empty";
        break;
    default:
        errstr = "Unknown error";
    }
    E_ERROR("JSON parsing failed: %s\n", errstr);
}